

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

size_t cookiehash(char *domain)

{
  _Bool _Var1;
  size_t sVar2;
  size_t local_28;
  size_t len;
  char *top;
  char *domain_local;
  
  if ((domain != (char *)0x0) && (top = domain, _Var1 = isip(domain), !_Var1)) {
    len = (size_t)get_top_domain(top,&local_28);
    sVar2 = cookie_hash_domain((char *)len,local_28);
    return sVar2;
  }
  return 0;
}

Assistant:

static size_t cookiehash(const char * const domain)
{
  const char *top;
  size_t len;

  if(!domain || isip(domain))
    return 0;

  top = get_top_domain(domain, &len);
  return cookie_hash_domain(top, len);
}